

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O0

void __thiscall
t_java_generator::generate_java_struct_equality
          (t_java_generator *this,ostream *out,t_struct *tstruct)

{
  t_struct *ptVar1;
  bool bVar2;
  int iVar3;
  e_req eVar4;
  uint uVar5;
  t_base tVar6;
  ostream *poVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  reference pptVar8;
  t_type *ptVar9;
  t_base_type *this_00;
  string *psVar10;
  logic_error *plVar11;
  t_base tbase;
  string local_640;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_620;
  string local_600;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c0;
  string local_5a0;
  string local_580 [8];
  string name_1;
  bool can_be_null_1;
  bool is_optional_1;
  t_type *t_1;
  t_field **local_548;
  string local_540;
  string local_520;
  undefined4 local_4fc;
  undefined4 local_4f8;
  int B_NO;
  int B_YES;
  int MUL;
  string local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  string local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  string local_230 [8];
  string unequal;
  string local_208 [8];
  string that_present;
  string local_1e0 [8];
  string this_present;
  string name;
  bool can_be_null;
  bool is_optional;
  t_type *t;
  t_field **local_188;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_180
  ;
  const_iterator m_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *members;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_40;
  t_struct *local_20;
  t_struct *tstruct_local;
  ostream *out_local;
  t_java_generator *this_local;
  
  local_20 = tstruct;
  tstruct_local = (t_struct *)out;
  out_local = (ostream *)this;
  t_generator::indent_abi_cxx11_(&local_40,(t_generator *)this);
  poVar7 = std::operator<<(out,(string *)&local_40);
  poVar7 = std::operator<<(poVar7,"@Override");
  poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_70,(t_generator *)this);
  poVar7 = std::operator<<(poVar7,(string *)&local_70);
  poVar7 = std::operator<<(poVar7,"public boolean equals(java.lang.Object that) {");
  std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_40);
  t_generator::indent_up((t_generator *)this);
  ptVar1 = tstruct_local;
  t_generator::indent_abi_cxx11_(&local_90,(t_generator *)this);
  poVar7 = std::operator<<((ostream *)ptVar1,(string *)&local_90);
  poVar7 = std::operator<<(poVar7,"if (that instanceof ");
  iVar3 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar7 = std::operator<<(poVar7,(string *)CONCAT44(extraout_var,iVar3));
  poVar7 = std::operator<<(poVar7,")");
  poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
  poVar7 = std::operator<<(poVar7,(string *)&local_b0);
  poVar7 = std::operator<<(poVar7,"  return this.equals((");
  iVar3 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar7 = std::operator<<(poVar7,(string *)CONCAT44(extraout_var_00,iVar3));
  poVar7 = std::operator<<(poVar7,")that);");
  poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this);
  poVar7 = std::operator<<(poVar7,(string *)&local_d0);
  poVar7 = std::operator<<(poVar7,"return false;");
  std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)tstruct_local);
  std::operator<<((ostream *)tstruct_local,(string *)&::endl_abi_cxx11_);
  ptVar1 = tstruct_local;
  t_generator::indent_abi_cxx11_(&local_f0,(t_generator *)this);
  poVar7 = std::operator<<((ostream *)ptVar1,(string *)&local_f0);
  poVar7 = std::operator<<(poVar7,"public boolean equals(");
  iVar3 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar7 = std::operator<<(poVar7,(string *)CONCAT44(extraout_var_01,iVar3));
  poVar7 = std::operator<<(poVar7," that) {");
  std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_f0);
  t_generator::indent_up((t_generator *)this);
  ptVar1 = tstruct_local;
  t_generator::indent_abi_cxx11_(&local_110,(t_generator *)this);
  poVar7 = std::operator<<((ostream *)ptVar1,(string *)&local_110);
  poVar7 = std::operator<<(poVar7,"if (that == null)");
  poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_130,(t_generator *)this);
  poVar7 = std::operator<<(poVar7,(string *)&local_130);
  poVar7 = std::operator<<(poVar7,"  return false;");
  poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_150,(t_generator *)this);
  poVar7 = std::operator<<(poVar7,(string *)&local_150);
  poVar7 = std::operator<<(poVar7,"if (this == that)");
  poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_((string *)&members,(t_generator *)this);
  poVar7 = std::operator<<(poVar7,(string *)&members);
  poVar7 = std::operator<<(poVar7,"  return true;");
  std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&members);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_110);
  m_iter._M_current = (t_field **)t_struct::get_members(local_20);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_180);
  local_188 = (t_field **)
              std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(m_iter._M_current);
  local_180._M_current = local_188;
  while( true ) {
    t = (t_type *)
        std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                  ((vector<t_field_*,_std::allocator<t_field_*>_> *)m_iter._M_current);
    bVar2 = __gnu_cxx::operator!=
                      (&local_180,
                       (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)&t);
    if (!bVar2) break;
    std::operator<<((ostream *)tstruct_local,(string *)&::endl_abi_cxx11_);
    pptVar8 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_180);
    ptVar9 = t_field::get_type(*pptVar8);
    ptVar9 = t_generator::get_true_type(ptVar9);
    pptVar8 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_180);
    eVar4 = t_field::get_req(*pptVar8);
    bVar2 = type_can_be_null(this,ptVar9);
    pptVar8 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_180);
    psVar10 = t_field::get_name_abi_cxx11_(*pptVar8);
    std::__cxx11::string::string
              ((string *)(this_present.field_2._M_local_buf + 8),(string *)psVar10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_1e0,"true",(allocator *)(that_present.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(that_present.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_208,"true",(allocator *)(unequal.field_2._M_local_buf + 0xf))
    ;
    std::allocator<char>::~allocator((allocator<char> *)(unequal.field_2._M_local_buf + 0xf));
    std::__cxx11::string::string(local_230);
    if ((eVar4 == T_OPTIONAL) || (bVar2)) {
      pptVar8 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_180);
      generate_isset_check_abi_cxx11_(&local_270,this,*pptVar8);
      std::operator+(&local_250," && this.",&local_270);
      std::__cxx11::string::operator+=(local_1e0,(string *)&local_250);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_270);
      pptVar8 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_180);
      generate_isset_check_abi_cxx11_(&local_2b0,this,*pptVar8);
      std::operator+(&local_290," && that.",&local_2b0);
      std::__cxx11::string::operator+=(local_208,(string *)&local_290);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_2b0);
    }
    ptVar1 = tstruct_local;
    t_generator::indent_abi_cxx11_(&local_2d0,(t_generator *)this);
    poVar7 = std::operator<<((ostream *)ptVar1,(string *)&local_2d0);
    poVar7 = std::operator<<(poVar7,"boolean this_present_");
    poVar7 = std::operator<<(poVar7,(string *)(this_present.field_2._M_local_buf + 8));
    poVar7 = std::operator<<(poVar7," = ");
    poVar7 = std::operator<<(poVar7,local_1e0);
    poVar7 = std::operator<<(poVar7,";");
    poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_2f0,(t_generator *)this);
    poVar7 = std::operator<<(poVar7,(string *)&local_2f0);
    poVar7 = std::operator<<(poVar7,"boolean that_present_");
    poVar7 = std::operator<<(poVar7,(string *)(this_present.field_2._M_local_buf + 8));
    poVar7 = std::operator<<(poVar7," = ");
    poVar7 = std::operator<<(poVar7,local_208);
    poVar7 = std::operator<<(poVar7,";");
    poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_310,(t_generator *)this);
    poVar7 = std::operator<<(poVar7,(string *)&local_310);
    poVar7 = std::operator<<(poVar7,"if (");
    poVar7 = std::operator<<(poVar7,"this_present_");
    poVar7 = std::operator<<(poVar7,(string *)(this_present.field_2._M_local_buf + 8));
    poVar7 = std::operator<<(poVar7," || that_present_");
    poVar7 = std::operator<<(poVar7,(string *)(this_present.field_2._M_local_buf + 8));
    poVar7 = std::operator<<(poVar7,") {");
    std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::~string((string *)&local_2d0);
    t_generator::indent_up((t_generator *)this);
    ptVar1 = tstruct_local;
    t_generator::indent_abi_cxx11_(&local_330,(t_generator *)this);
    poVar7 = std::operator<<((ostream *)ptVar1,(string *)&local_330);
    poVar7 = std::operator<<(poVar7,"if (!(");
    poVar7 = std::operator<<(poVar7,"this_present_");
    poVar7 = std::operator<<(poVar7,(string *)(this_present.field_2._M_local_buf + 8));
    poVar7 = std::operator<<(poVar7," && that_present_");
    poVar7 = std::operator<<(poVar7,(string *)(this_present.field_2._M_local_buf + 8));
    poVar7 = std::operator<<(poVar7,"))");
    poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_350,(t_generator *)this);
    poVar7 = std::operator<<(poVar7,(string *)&local_350);
    poVar7 = std::operator<<(poVar7,"  return false;");
    std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_330);
    uVar5 = (*(ptVar9->super_t_doc)._vptr_t_doc[7])();
    if ((uVar5 & 1) == 0) {
      if (bVar2) {
        std::operator+(&local_450,"!this.",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&this_present.field_2 + 8));
        std::operator+(&local_430,&local_450,".equals(that.");
        std::operator+(&local_410,&local_430,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&this_present.field_2 + 8));
        std::operator+(&local_3f0,&local_410,")");
        std::__cxx11::string::operator=(local_230,(string *)&local_3f0);
        std::__cxx11::string::~string((string *)&local_3f0);
        std::__cxx11::string::~string((string *)&local_410);
        std::__cxx11::string::~string((string *)&local_430);
        std::__cxx11::string::~string((string *)&local_450);
      }
      else {
        std::operator+(&local_4b0,"this.",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&this_present.field_2 + 8));
        std::operator+(&local_490,&local_4b0," != that.");
        std::operator+(&local_470,&local_490,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&this_present.field_2 + 8));
        std::__cxx11::string::operator=(local_230,(string *)&local_470);
        std::__cxx11::string::~string((string *)&local_470);
        std::__cxx11::string::~string((string *)&local_490);
        std::__cxx11::string::~string((string *)&local_4b0);
      }
    }
    else {
      std::operator+(&local_3d0,"!this.",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&this_present.field_2 + 8));
      std::operator+(&local_3b0,&local_3d0,".equals(that.");
      std::operator+(&local_390,&local_3b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&this_present.field_2 + 8));
      std::operator+(&local_370,&local_390,")");
      std::__cxx11::string::operator=(local_230,(string *)&local_370);
      std::__cxx11::string::~string((string *)&local_370);
      std::__cxx11::string::~string((string *)&local_390);
      std::__cxx11::string::~string((string *)&local_3b0);
      std::__cxx11::string::~string((string *)&local_3d0);
    }
    ptVar1 = tstruct_local;
    t_generator::indent_abi_cxx11_(&local_4d0,(t_generator *)this);
    poVar7 = std::operator<<((ostream *)ptVar1,(string *)&local_4d0);
    poVar7 = std::operator<<(poVar7,"if (");
    poVar7 = std::operator<<(poVar7,local_230);
    poVar7 = std::operator<<(poVar7,")");
    poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_((string *)&B_YES,(t_generator *)this);
    poVar7 = std::operator<<(poVar7,(string *)&B_YES);
    poVar7 = std::operator<<(poVar7,"  return false;");
    std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&B_YES);
    std::__cxx11::string::~string((string *)&local_4d0);
    t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)tstruct_local);
    std::__cxx11::string::~string(local_230);
    std::__cxx11::string::~string(local_208);
    std::__cxx11::string::~string(local_1e0);
    std::__cxx11::string::~string((string *)(this_present.field_2._M_local_buf + 8));
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_180);
  }
  std::operator<<((ostream *)tstruct_local,(string *)&::endl_abi_cxx11_);
  poVar7 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar7 = std::operator<<(poVar7,"return true;");
  std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)tstruct_local);
  std::operator<<((ostream *)tstruct_local,(string *)&::endl_abi_cxx11_);
  ptVar1 = tstruct_local;
  B_NO = 0x1fff;
  local_4f8 = 0x1ffff;
  local_4fc = 0x7ffff;
  t_generator::indent_abi_cxx11_(&local_520,(t_generator *)this);
  poVar7 = std::operator<<((ostream *)ptVar1,(string *)&local_520);
  poVar7 = std::operator<<(poVar7,"@Override");
  poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_540,(t_generator *)this);
  poVar7 = std::operator<<(poVar7,(string *)&local_540);
  poVar7 = std::operator<<(poVar7,"public int hashCode() {");
  std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_540);
  std::__cxx11::string::~string((string *)&local_520);
  t_generator::indent_up((t_generator *)this);
  poVar7 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar7 = std::operator<<(poVar7,"int hashCode = 1;");
  std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  local_548 = (t_field **)
              std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(m_iter._M_current);
  local_180._M_current = local_548;
  while( true ) {
    t_1 = (t_type *)
          std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                    ((vector<t_field_*,_std::allocator<t_field_*>_> *)m_iter._M_current);
    bVar2 = __gnu_cxx::operator!=
                      (&local_180,
                       (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)&t_1);
    if (!bVar2) break;
    std::operator<<((ostream *)tstruct_local,(string *)&::endl_abi_cxx11_);
    pptVar8 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_180);
    ptVar9 = t_field::get_type(*pptVar8);
    this_00 = (t_base_type *)t_generator::get_true_type(ptVar9);
    pptVar8 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_180);
    eVar4 = t_field::get_req(*pptVar8);
    name_1.field_2._M_local_buf[0xf] = eVar4 == T_OPTIONAL;
    name_1.field_2._M_local_buf[0xe] = type_can_be_null(this,(t_type *)this_00);
    pptVar8 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_180);
    psVar10 = t_field::get_name_abi_cxx11_(*pptVar8);
    std::__cxx11::string::string(local_580,(string *)psVar10);
    if (((name_1.field_2._M_local_buf[0xf] & 1U) != 0) ||
       ((name_1.field_2._M_local_buf[0xe] & 1U) != 0)) {
      poVar7 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
      poVar7 = std::operator<<(poVar7,"hashCode = hashCode * ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x1fff);
      poVar7 = std::operator<<(poVar7," + ((");
      pptVar8 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_180);
      generate_isset_check_abi_cxx11_(&local_5a0,this,*pptVar8);
      poVar7 = std::operator<<(poVar7,(string *)&local_5a0);
      poVar7 = std::operator<<(poVar7,") ? ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x1ffff);
      poVar7 = std::operator<<(poVar7," : ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x7ffff);
      poVar7 = std::operator<<(poVar7,");");
      std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_5a0);
    }
    if (((name_1.field_2._M_local_buf[0xf] & 1U) != 0) ||
       ((name_1.field_2._M_local_buf[0xe] & 1U) != 0)) {
      poVar7 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
      pptVar8 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_180);
      generate_isset_check_abi_cxx11_(&local_600,this,*pptVar8);
      std::operator+(&local_5e0,"if (",&local_600);
      std::operator+(&local_5c0,&local_5e0,")");
      poVar7 = std::operator<<(poVar7,(string *)&local_5c0);
      std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_5c0);
      std::__cxx11::string::~string((string *)&local_5e0);
      std::__cxx11::string::~string((string *)&local_600);
      t_generator::indent_up((t_generator *)this);
    }
    uVar5 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[10])();
    if ((uVar5 & 1) == 0) {
      uVar5 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[5])();
      if ((uVar5 & 1) == 0) {
        poVar7 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
        poVar7 = std::operator<<(poVar7,"hashCode = hashCode * ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x1fff);
        poVar7 = std::operator<<(poVar7," + ");
        poVar7 = std::operator<<(poVar7,local_580);
        poVar7 = std::operator<<(poVar7,".hashCode();");
        std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
      }
      else {
        tVar6 = t_base_type::get_base(this_00);
        switch(tVar6) {
        case TYPE_VOID:
          plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar11,"compiler error: a struct field cannot be void");
          __cxa_throw(plVar11,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        case TYPE_STRING:
          poVar7 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
          poVar7 = std::operator<<(poVar7,"hashCode = hashCode * ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x1fff);
          poVar7 = std::operator<<(poVar7," + ");
          poVar7 = std::operator<<(poVar7,local_580);
          poVar7 = std::operator<<(poVar7,".hashCode();");
          std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
          break;
        case TYPE_BOOL:
          poVar7 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
          poVar7 = std::operator<<(poVar7,"hashCode = hashCode * ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x1fff);
          poVar7 = std::operator<<(poVar7," + ((");
          poVar7 = std::operator<<(poVar7,local_580);
          poVar7 = std::operator<<(poVar7,") ? ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x1ffff);
          poVar7 = std::operator<<(poVar7," : ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x7ffff);
          poVar7 = std::operator<<(poVar7,");");
          std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
          break;
        case TYPE_I8:
          poVar7 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
          poVar7 = std::operator<<(poVar7,"hashCode = hashCode * ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x1fff);
          poVar7 = std::operator<<(poVar7," + (int) (");
          poVar7 = std::operator<<(poVar7,local_580);
          poVar7 = std::operator<<(poVar7,");");
          std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
          break;
        case TYPE_I16:
        case TYPE_I32:
          poVar7 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
          poVar7 = std::operator<<(poVar7,"hashCode = hashCode * ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x1fff);
          poVar7 = std::operator<<(poVar7," + ");
          poVar7 = std::operator<<(poVar7,local_580);
          poVar7 = std::operator<<(poVar7,";");
          std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
          break;
        case TYPE_I64:
        case TYPE_DOUBLE:
          poVar7 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
          poVar7 = std::operator<<(poVar7,"hashCode = hashCode * ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x1fff);
          poVar7 = std::operator<<(poVar7," + org.apache.thrift.TBaseHelper.hashCode(");
          poVar7 = std::operator<<(poVar7,local_580);
          poVar7 = std::operator<<(poVar7,");");
          std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
          break;
        default:
          plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
          tVar6 = t_base_type::get_base(this_00);
          t_base_type::t_base_name_abi_cxx11_(&local_640,(t_base_type *)(ulong)tVar6,tbase);
          std::operator+(&local_620,
                         "compiler error: the following base type has no hashcode generator: ",
                         &local_640);
          std::logic_error::logic_error(plVar11,(string *)&local_620);
          __cxa_throw(plVar11,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
      }
    }
    else {
      poVar7 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
      poVar7 = std::operator<<(poVar7,"hashCode = hashCode * ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x1fff);
      poVar7 = std::operator<<(poVar7," + ");
      poVar7 = std::operator<<(poVar7,local_580);
      poVar7 = std::operator<<(poVar7,".getValue();");
      std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
    }
    if (((name_1.field_2._M_local_buf[0xf] & 1U) != 0) ||
       ((name_1.field_2._M_local_buf[0xe] & 1U) != 0)) {
      t_generator::indent_down((t_generator *)this);
    }
    std::__cxx11::string::~string(local_580);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_180);
  }
  std::operator<<((ostream *)tstruct_local,(string *)&::endl_abi_cxx11_);
  poVar7 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar7 = std::operator<<(poVar7,"return hashCode;");
  std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  t_generator::indent_down((t_generator *)this);
  poVar7 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar7 = std::operator<<(poVar7,"}");
  poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_java_generator::generate_java_struct_equality(ostream& out, t_struct* tstruct) {
  out << indent() << "@Override" << endl << indent() << "public boolean equals(java.lang.Object that) {"
      << endl;
  indent_up();
  out << indent() << "if (that instanceof " << tstruct->get_name() << ")" << endl << indent()
      << "  return this.equals((" << tstruct->get_name() << ")that);" << endl << indent()
      << "return false;" << endl;
  scope_down(out);
  out << endl;

  out << indent() << "public boolean equals(" << tstruct->get_name() << " that) {" << endl;
  indent_up();
  out << indent() << "if (that == null)" << endl << indent() << "  return false;" << endl
      << indent() << "if (this == that)" << endl << indent() << "  return true;"  << endl;

  const vector<t_field*>& members = tstruct->get_members();
  vector<t_field*>::const_iterator m_iter;
  for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
    out << endl;

    t_type* t = get_true_type((*m_iter)->get_type());
    // Most existing Thrift code does not use isset or optional/required,
    // so we treat "default" fields as required.
    bool is_optional = (*m_iter)->get_req() == t_field::T_OPTIONAL;
    bool can_be_null = type_can_be_null(t);
    string name = (*m_iter)->get_name();

    string this_present = "true";
    string that_present = "true";
    string unequal;

    if (is_optional || can_be_null) {
      this_present += " && this." + generate_isset_check(*m_iter);
      that_present += " && that." + generate_isset_check(*m_iter);
    }

    out << indent() << "boolean this_present_" << name << " = " << this_present << ";" << endl
        << indent() << "boolean that_present_" << name << " = " << that_present << ";" << endl
        << indent() << "if ("
        << "this_present_" << name << " || that_present_" << name << ") {" << endl;
    indent_up();
    out << indent() << "if (!("
        << "this_present_" << name << " && that_present_" << name << "))" << endl << indent()
        << "  return false;" << endl;

    if (t->is_binary()) {
      unequal = "!this." + name + ".equals(that." + name + ")";
    } else if (can_be_null) {
      unequal = "!this." + name + ".equals(that." + name + ")";
    } else {
      unequal = "this." + name + " != that." + name;
    }

    out << indent() << "if (" << unequal << ")" << endl << indent() << "  return false;" << endl;

    scope_down(out);
  }
  out << endl;
  indent(out) << "return true;" << endl;
  scope_down(out);
  out << endl;

  const int MUL = 8191; // HashCode multiplier
  const int B_YES = 131071;
  const int B_NO = 524287;
  out << indent() << "@Override" << endl << indent() << "public int hashCode() {" << endl;
  indent_up();
  indent(out) << "int hashCode = 1;" << endl;

  for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
    out << endl;

    t_type* t = get_true_type((*m_iter)->get_type());
    bool is_optional = (*m_iter)->get_req() == t_field::T_OPTIONAL;
    bool can_be_null = type_can_be_null(t);
    string name = (*m_iter)->get_name();

    if (is_optional || can_be_null) {
      indent(out) << "hashCode = hashCode * " << MUL << " + ((" << generate_isset_check(*m_iter)
                  << ") ? " << B_YES << " : " << B_NO << ");" << endl;
    }

    if (is_optional || can_be_null) {
      indent(out) << "if (" + generate_isset_check(*m_iter) + ")" << endl;
      indent_up();
    }

    if (t->is_enum()) {
      indent(out) << "hashCode = hashCode * " << MUL << " + " << name << ".getValue();" << endl;
    } else if (t->is_base_type()) {
      switch(((t_base_type*)t)->get_base()) {
      case t_base_type::TYPE_STRING:
        indent(out) << "hashCode = hashCode * " << MUL << " + " << name << ".hashCode();" << endl;
        break;
      case t_base_type::TYPE_BOOL:
        indent(out) << "hashCode = hashCode * " << MUL << " + ((" << name << ") ? "
                    << B_YES << " : " << B_NO << ");" << endl;
        break;
      case t_base_type::TYPE_I8:
        indent(out) << "hashCode = hashCode * " << MUL << " + (int) (" << name << ");" << endl;
        break;
      case t_base_type::TYPE_I16:
      case t_base_type::TYPE_I32:
        indent(out) << "hashCode = hashCode * " << MUL << " + " << name << ";" << endl;
        break;
      case t_base_type::TYPE_I64:
      case t_base_type::TYPE_DOUBLE:
        indent(out) << "hashCode = hashCode * " << MUL << " + org.apache.thrift.TBaseHelper.hashCode(" << name << ");" << endl;
        break;
      case t_base_type::TYPE_VOID:
        throw std::logic_error("compiler error: a struct field cannot be void");
      default:
        throw std::logic_error("compiler error: the following base type has no hashcode generator: " +
               t_base_type::t_base_name(((t_base_type*)t)->get_base()));
      }
    } else {
      indent(out) << "hashCode = hashCode * " << MUL << " + " << name << ".hashCode();" << endl;
    }

    if (is_optional || can_be_null) {
      indent_down();
    }
  }

  out << endl;
  indent(out) << "return hashCode;" << endl;
  indent_down();
  indent(out) << "}" << endl << endl;
}